

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O3

char * addpackagedir(char *dir)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  packagedir *ppVar4;
  size_t sVar5;
  char *__dest;
  char *__dest_00;
  long lVar6;
  string pdir;
  char acStack_138 [259];
  undefined1 local_35;
  
  strncpy(acStack_138,dir,0x104);
  local_35 = 0;
  bVar1 = subhomedir(acStack_138,0x104,dir);
  if ((bVar1) && (sVar3 = fixpackagedir(acStack_138), sVar3 != 0)) {
    for (__s = strstr(acStack_138,"packages"); __s != (char *)0x0; __s = strstr(__s + 8,"packages"))
    {
      lVar6 = (long)__s - (long)acStack_138;
      if (((acStack_138 <= __s && lVar6 != 0) && (__s[-1] == '/')) && (__s[8] == '/')) {
        ppVar4 = vector<packagedir>::add(&packagedirs);
        __dest = (char *)operator_new__(lVar6 + 1U);
        strncpy(__dest,acStack_138,lVar6 + 1U);
        __dest[lVar6] = '\0';
        ppVar4->dir = __dest;
        ppVar4->dirlen = (int)lVar6;
        sVar5 = strlen(__s);
        __dest_00 = (char *)operator_new__(sVar5 + 1);
        strncpy(__dest_00,__s,sVar5 + 1);
        __dest_00[sVar5] = '\0';
        ppVar4->filter = __dest_00;
        sVar5 = strlen(__s);
        iVar2 = (int)sVar5;
        goto LAB_001594da;
      }
    }
    ppVar4 = vector<packagedir>::add(&packagedirs);
    sVar5 = strlen(acStack_138);
    __dest = (char *)operator_new__(sVar5 + 1);
    strncpy(__dest,acStack_138,sVar5 + 1);
    __dest[sVar5] = '\0';
    ppVar4->dir = __dest;
    sVar5 = strlen(acStack_138);
    ppVar4->dirlen = (int)sVar5;
    ppVar4->filter = (char *)0x0;
    iVar2 = 0;
LAB_001594da:
    ppVar4->filterlen = iVar2;
  }
  else {
    __dest = (char *)0x0;
  }
  return __dest;
}

Assistant:

const char *addpackagedir(const char *dir)
{
    string pdir;
    copystring(pdir, dir);
    if(!subhomedir(pdir, sizeof(pdir), dir) || !fixpackagedir(pdir)) return NULL;
    char *filter = pdir;
    for(;;)
    {
        static int len = strlen("packages");
        filter = strstr(filter, "packages");
        if(!filter) break;
        if(filter > pdir && filter[-1] == PATHDIV && filter[len] == PATHDIV) break;
        filter += len;
    }
    packagedir &pf = packagedirs.add();
    pf.dir = filter ? newstring(pdir, filter-pdir) : newstring(pdir);
    pf.dirlen = filter ? filter-pdir : strlen(pdir);
    pf.filter = filter ? newstring(filter) : NULL;
    pf.filterlen = filter ? strlen(filter) : 0;
    return pf.dir;
}